

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inner-lib-tests.cpp
# Opt level: O2

void MultiLibTest(bool *result)

{
  long lVar1;
  LibClass *this;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uStack_40;
  uint64_t memLeakSize;
  size_t memLeakCount;
  
  __start(false,"",false);
  this = (LibClass *)operator_new(0x50);
  LibClass::LibClass(this);
  __mem_leak_check(&memLeakCount,&memLeakSize,false,"",false);
  if (memLeakCount == 4) {
    lVar1 = CONCAT44(memLeakSize._4_4_,(uint)memLeakSize);
    sVar2 = LibClass::getSizeOfInternalClass();
    if (lVar1 == sVar2 + 0x58) {
      LibClass::doSomething(this);
      __mem_leak_check(&memLeakCount,&memLeakSize,false,"",false);
      if (memLeakCount != 0x2c) {
        uVar3 = 0xf;
        uStack_40 = 0x2c;
        goto LAB_001023af;
      }
      lVar1 = CONCAT44(memLeakSize._4_4_,(uint)memLeakSize);
      sVar2 = LibClass::getSizeOfInternalClass();
      if (lVar1 == sVar2 * 0x15 + 0x58) {
        LibClass::~LibClass(this);
        operator_delete(this,0x50);
        __mem_leak_check(&memLeakCount,&memLeakSize,false,"",false);
        if (memLeakCount != 0x28) {
          uStack_40 = 0x13;
          uVar3 = uStack_40;
          uStack_40 = 0x28;
          goto LAB_001023af;
        }
        lVar1 = CONCAT44(memLeakSize._4_4_,(uint)memLeakSize);
        sVar2 = LibClass::getSizeOfInternalClass();
        if (lVar1 == sVar2 * 0x14) {
          __stop_and_free_all_mem();
          return;
        }
        sVar2 = LibClass::getSizeOfInternalClass();
        uVar4 = (ulong)(uint)((int)sVar2 * 0x14);
        uStack_40 = 0x13;
      }
      else {
        sVar2 = LibClass::getSizeOfInternalClass();
        uVar4 = (ulong)((int)sVar2 * 0x15 + 0x58);
        uStack_40 = 0xf;
      }
    }
    else {
      sVar2 = LibClass::getSizeOfInternalClass();
      uVar4 = (ulong)((int)sVar2 + 0x58);
      uStack_40 = 0xb;
    }
    memLeakCount = (size_t)(uint)memLeakSize;
    uVar3 = uStack_40;
    uStack_40 = uVar4;
  }
  else {
    uVar3 = 0xb;
    uStack_40 = 4;
  }
LAB_001023af:
  printf("%s:%d: FAILED. assert equal failed: actual: %d != expected: %d\n","MultiLibTest",uVar3,
         memLeakCount,uStack_40);
  *result = false;
  return;
}

Assistant:

TEST_CASE(MultiLibTest) {

    START_TEST;

    LibClass* libClass = new LibClass();

    CHECK_MEM_LEAK(4, sizeof(LibClass) + sizeof(double) + LibClass::getSizeOfInternalClass());

    libClass->doSomething();

    CHECK_MEM_LEAK(44, sizeof(LibClass) + sizeof(double) + 21*LibClass::getSizeOfInternalClass());

    delete libClass;

    CHECK_MEM_LEAK(40, 20*libClass->getSizeOfInternalClass());

    STOP_TEST;
}